

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal_buf.h
# Opt level: O3

int __thiscall cppcms::util::stackbuf<128UL>::overflow(stackbuf<128UL> *this,int c)

{
  char *pcVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  
  if (*(undefined1 **)&this->field_0x20 == this->on_stack_) {
    pcVar1 = (char *)malloc(0x101);
    this->on_heap_ = pcVar1;
    if (pcVar1 == (char *)0x0) goto LAB_001e0164;
    memcpy(pcVar1,this->on_stack_,0x80);
    *(char **)&this->field_0x20 = pcVar1;
    *(char **)&this->field_0x30 = pcVar1 + 0x100;
    pcVar1 = pcVar1 + 0x80;
    *(char **)&this->field_0x28 = pcVar1;
    if (c == -1) {
      return 0;
    }
  }
  else {
    lVar4 = *(long *)&this->field_0x28 - (long)*(undefined1 **)&this->field_0x20;
    pcVar1 = (char *)realloc(this->on_heap_,lVar4 * 2 + 1);
    if (pcVar1 == (char *)0x0) {
LAB_001e0164:
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = booster::log::logger::instance;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    this->on_heap_ = pcVar1;
    lVar3 = (long)(int)lVar4;
    *(char **)&this->field_0x20 = pcVar1;
    *(char **)&this->field_0x30 = pcVar1 + lVar4 * 2;
    pcVar1 = pcVar1 + lVar3;
    *(char **)&this->field_0x28 = pcVar1;
    if (c == -1) {
      return 0;
    }
    if (SBORROW8(lVar3,lVar4 * 2) == lVar3 + lVar4 * -2 < 0) {
      (**(code **)(*(long *)this + 0x68))(this,c & 0xff);
      return 0;
    }
  }
  *pcVar1 = (char)c;
  *(char **)&this->field_0x28 = pcVar1 + 1;
  return 0;
}

Assistant:

int overflow(int c)
		{
			size_t current_size;
			size_t new_size;
			if(pbase() == on_stack_) {
				current_size = OnStackSize;
				new_size = OnStackSize * 2;
				on_heap_ = (char *)malloc(new_size + 1);
				if(!on_heap_)
					throw std::bad_alloc();
				memcpy(on_heap_,on_stack_,current_size);
			}
			else {
				current_size = pptr() - pbase();
				new_size = current_size * 2;
				char *new_ptr = (char *)realloc(on_heap_,new_size + 1);
				if(!new_ptr)
					throw std::bad_alloc();
				on_heap_ = new_ptr;

			}
			setp(on_heap_,on_heap_ + new_size);
			pbump(current_size);
			if(c!=EOF)
				sputc(c);
			return 0;
		}